

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  float *pfVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ImGuiContext *ctx;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pIVar6 = GImGui;
  iVar10 = components + -1;
  pIVar4 = GImGui->CurrentWindow;
  fVar14 = (GImGui->Style).ItemInnerSpacing.x;
  fVar12 = (float)(int)((w_full - fVar14 * (float)iVar10) / (float)components);
  fVar13 = 1.0;
  if (1.0 <= fVar12) {
    fVar13 = fVar12;
  }
  fVar12 = (float)(int)(w_full - (fVar14 + fVar13) * (float)iVar10);
  fVar14 = 1.0;
  if (1.0 <= fVar12) {
    fVar14 = fVar12;
  }
  iVar11 = (pIVar4->DC).ItemWidthStack.Size;
  iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
  if (iVar11 == iVar3) {
    iVar11 = iVar11 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar3 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar11 << 2,GImAllocatorUserData);
      pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
      if (pfVar5 != (float *)0x0) {
        memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
        pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
        if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
      }
      (pIVar4->DC).ItemWidthStack.Data = pfVar7;
      (pIVar4->DC).ItemWidthStack.Capacity = iVar11;
    }
  }
  (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = fVar14;
  pIVar2 = &(pIVar4->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if (1 < components) {
    do {
      iVar11 = (pIVar4->DC).ItemWidthStack.Size;
      iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
      if (iVar11 == iVar3) {
        if (iVar3 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar3 / 2 + iVar3;
        }
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar9) {
          iVar11 = iVar9;
        }
        if (iVar3 < iVar11) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar11 << 2,GImAllocatorUserData);
          pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
          if (pfVar5 != (float *)0x0) {
            memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
            pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
            if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
          }
          (pIVar4->DC).ItemWidthStack.Data = pfVar7;
          (pIVar4->DC).ItemWidthStack.Capacity = iVar11;
        }
      }
      (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = fVar13;
      pIVar2 = &(pIVar4->DC).ItemWidthStack;
      pIVar2->Size = pIVar2->Size + 1;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  lVar8 = (long)(pIVar4->DC).ItemWidthStack.Size;
  if (0 < lVar8) {
    (pIVar4->DC).ItemWidth = (pIVar4->DC).ItemWidthStack.Data[lVar8 + -1];
    *(byte *)&(pIVar6->NextItemData).Flags = (byte)(pIVar6->NextItemData).Flags & 0xfe;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x538,"T &ImVector<float>::back() [T = float]");
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}